

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O3

void __thiscall buffer::buffer(buffer *this,int init_size)

{
  char *pcVar1;
  
  this->init_size_ = init_size;
  if (init_size < 1) {
    pcVar1 = (char *)0x0;
    init_size = 0;
  }
  else {
    pcVar1 = (char *)malloc((ulong)(uint)init_size);
  }
  this->buffer_ = pcVar1;
  this->begin_ = pcVar1;
  this->end_ = pcVar1;
  this->capacity_ = init_size;
  return;
}

Assistant:

buffer::buffer(int init_size)
{
    init_size_ = init_size;
    if (init_size_ > 0)
    {
        buffer_ = (char*)malloc(init_size_);
        begin_ = buffer_;
        end_ = begin_;
        capacity_ = init_size_;
    }
    else
    {
        buffer_ = NULL;
        begin_ = NULL;
        end_ = NULL;
        capacity_ = 0;
    }
}